

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif.cpp
# Opt level: O0

void __thiscall Potassco::AspifOutput::theoryTerm(AspifOutput *this,Id_t termId,int number)

{
  Directive_t in_ESI;
  AspifOutput *in_RDI;
  int in_stack_ffffffffffffffdc;
  AspifOutput *in_stack_ffffffffffffffe8;
  
  Directive_t::Directive_t((Directive_t *)&stack0xffffffffffffffec,Theory);
  startDir(in_stack_ffffffffffffffe8,in_ESI);
  add(in_RDI,in_stack_ffffffffffffffdc);
  add(in_RDI,in_stack_ffffffffffffffdc);
  add(in_RDI,in_stack_ffffffffffffffdc);
  endDir(in_RDI);
  return;
}

Assistant:

void AspifOutput::theoryTerm(Id_t termId, int number) {
	startDir(Directive_t::Theory).add(Theory_t::Number).add(termId).add(number).endDir();
}